

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O2

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addCommandWithDefaultValues<char_const(&)[5]>
          (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *__return_storage_ptr__,
          API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
          *this,char (*name) [5],ValueOptions opt,bool isSubCommandRequired,String *desc,
          String *longDesc,StringList *defaultValues,String *valueSpecifier)

{
  CmdLine *pCVar1;
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  *pAVar2;
  Command *this_00;
  ArgPtr local_48;
  API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
  *local_38;
  
  local_38 = this;
  this_00 = (Command *)operator_new(0xf0);
  Command::Command<char_const(&)[5]>(this_00,name,opt,isSubCommandRequired);
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if ((defaultValues->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (defaultValues->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->m_defaultValues,defaultValues);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  pAVar2 = local_38;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
       (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)(Deleter<Args::ArgIface>)0x1;
  local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl = (ArgIface *)this_00;
  CmdLine::addArg(*(CmdLine **)(local_38 + 0x10),&local_48);
  if (((Command *)
       local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
       _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl != (Command *)0x0) &&
     (local_48._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
      _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete ==
      (Deleter<Args::ArgIface>)0x1)) {
    (*(((GroupIface *)
       &(local_48._M_t.
         super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
         super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
         super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface)->
      super_ArgIface)._vptr_ArgIface[1])();
  }
  pCVar1 = *(CmdLine **)(pAVar2 + 0x10);
  __return_storage_ptr__->_vptr_API = (_func_int **)&PTR__API_0015e890;
  __return_storage_ptr__->m_parent = pCVar1;
  __return_storage_ptr__->m_self = this_00;
  return __return_storage_ptr__;
}

Assistant:

API< PARENT, Command, ARGPTR, false > addCommandWithDefaultValues(
		//! Name of the group.
		NAME && name,
		//! Value type.
		ValueOptions opt = ValueOptions::NoValue,
		//! Is sub-command required?
		bool isSubCommandRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const StringList & defaultValues = StringList(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{
		auto cmd = std::unique_ptr< Command, details::Deleter< ArgIface > > (
			new Command( std::forward< NAME > ( name ), opt, isSubCommandRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			cmd->setDescription( desc );

		if( !longDesc.empty() )
			cmd->setLongDescription( longDesc );

		if( !defaultValues.empty() )
			cmd->setDefaultValues( defaultValues );

		if( !valueSpecifier.empty() )
			cmd->setValueSpecifier( valueSpecifier );

		Command & c = *cmd;

		ARGPTR arg = std::move( cmd );

		m_self.addArg( std::move( arg ) );

		return API< PARENT, Command, ARGPTR, false > ( m_self, c );
	}